

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::CreateGenerationObjects(cmGlobalGenerator *this,TargetTypes targetTypes)

{
  CreateLocalGenerators(this);
  if (this->ConfigureDoneCMP0026AndCMP0024 == true) {
    CheckTargetProperties(this);
  }
  CreateGeneratorTargets(this,targetTypes);
  if (targetTypes != AllTargets) {
    return;
  }
  ComputeBuildFileGenerators(this);
  return;
}

Assistant:

void cmGlobalGenerator::CreateGenerationObjects(TargetTypes targetTypes)
{
  this->CreateLocalGenerators();
  // Commit side effects only if we are actually generating
  if (this->GetConfigureDoneCMP0026()) {
    this->CheckTargetProperties();
  }
  this->CreateGeneratorTargets(targetTypes);
  if (targetTypes == TargetTypes::AllTargets) {
    this->ComputeBuildFileGenerators();
  }
}